

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O1

Option * __thiscall
CLI::App::add_complex<std::complex<double>>
          (App *this,string *name,complex<double> *variable,string *description,bool defaulted,
          string *label)

{
  pointer pcVar1;
  Option *pOVar2;
  undefined8 uVar3;
  string simple_name;
  callback_t fun;
  stringstream out;
  undefined1 *local_298;
  long local_290;
  undefined1 local_288 [16];
  _Any_data local_278;
  code *local_268;
  _Any_data local_258;
  code *local_248;
  undefined1 *local_238 [2];
  undefined1 local_228 [16];
  string local_218;
  string local_1f8;
  undefined1 *local_1d8;
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [8];
  _Alloc_hider local_1b0;
  ostream local_1a8 [8];
  undefined1 local_1a0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_190;
  undefined1 local_180 [72];
  ios_base local_138 [264];
  
  detail::split((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_1b8,name,',');
  if ((undefined1  [8])local_1b0._M_p != local_1b8) {
    local_298 = local_288;
    pcVar1 = ((_Alloc_hider *)local_1b8)->_M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,pcVar1,pcVar1 + *(size_type *)((long)local_1b8 + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_1b8);
    local_1b8 = (undefined1  [8])variable;
    local_1b0._M_p = (pointer)local_1a0;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1b0,local_298,local_298 + local_290);
    pcVar1 = (label->_M_dataplus)._M_p;
    local_190._M_allocated_capacity = (size_type)local_180;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)(local_1a0 + 0x10),pcVar1,pcVar1 + label->_M_string_length);
    ::std::function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>::
    function<CLI::App::add_complex<std::complex<double>>(std::__cxx11::string,std::complex<double>&,std::__cxx11::string,bool,std::__cxx11::string)::_lambda(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)_1_,void>
              ((function<bool(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>)>
                *)local_258._M_pod_data,(anon_class_72_3_15b80c14 *)local_1b8);
    if ((undefined1 *)local_190._M_allocated_capacity != local_180) {
      operator_delete((void *)local_190._M_allocated_capacity);
    }
    if ((pointer)local_1b0._M_p != (pointer)local_1a0) {
      operator_delete(local_1b0._M_p);
    }
    pcVar1 = (name->_M_dataplus)._M_p;
    local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_1f8,pcVar1,pcVar1 + name->_M_string_length);
    std::
    function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
    ::function((function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
                *)&local_278,
               (function<bool_(std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>)>
                *)&local_258);
    pcVar1 = (description->_M_dataplus)._M_p;
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_218,pcVar1,pcVar1 + description->_M_string_length);
    pOVar2 = add_option(this,&local_1f8,(callback_t *)&local_278,&local_218,defaulted);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p);
    }
    if (local_268 != (code *)0x0) {
      (*local_268)(&local_278,&local_278,__destroy_functor);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
      operator_delete(local_1f8._M_dataplus._M_p);
    }
    pcVar1 = (label->_M_dataplus)._M_p;
    local_238[0] = local_228;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)local_238,pcVar1,pcVar1 + label->_M_string_length);
    ::std::__cxx11::string::_M_assign((string *)&pOVar2->typeval_);
    pOVar2->expected_ = 2;
    pOVar2->changeable_ = false;
    if (local_238[0] != local_228) {
      operator_delete(local_238[0]);
    }
    if (defaulted) {
      ::std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
      ::std::operator<<(local_1a8,(complex *)variable);
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_assign((string *)&pOVar2->defaultval_);
      if (local_1d8 != local_1c8) {
        operator_delete(local_1d8);
      }
      ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
      ::std::ios_base::~ios_base(local_138);
    }
    if (local_248 != (code *)0x0) {
      (*local_248)(&local_258,&local_258,__destroy_functor);
    }
    if (local_298 != local_288) {
      operator_delete(local_298);
    }
    return pOVar2;
  }
  uVar3 = ::std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
  if (local_1d8 != local_1c8) {
    operator_delete(local_1d8);
  }
  ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  ::std::ios_base::~ios_base(local_138);
  if (local_248 != (code *)0x0) {
    (*local_248)(&local_258,&local_258,__destroy_functor);
  }
  if (local_298 != local_288) {
    operator_delete(local_298);
  }
  _Unwind_Resume(uVar3);
}

Assistant:

Option *add_complex(std::string name,
                        T &variable,
                        std::string description = "",
                        bool defaulted = false,
                        std::string label = "COMPLEX") {

        std::string simple_name = CLI::detail::split(name, ',').at(0);
        CLI::callback_t fun = [&variable, simple_name, label](results_t res) {
            double x, y;
            bool worked = detail::lexical_cast(res[0], x) && detail::lexical_cast(res[1], y);
            if(worked)
                variable = T(x, y);
            return worked;
        };

        CLI::Option *opt = add_option(name, fun, description, defaulted);
        opt->set_custom_option(label, 2);
        if(defaulted) {
            std::stringstream out;
            out << variable;
            opt->set_default_str(out.str());
        }
        return opt;
    }